

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool absl::lts_20240722::container_internal::AreItersFromSameContainer
               (ctrl_t *ctrl_a,ctrl_t *ctrl_b,void **slot_a,void **slot_b)

{
  bool bVar1;
  bool bVar2;
  bool local_4d;
  void *local_48;
  void *hi_slot;
  void *low_slot;
  void **ppvStack_30;
  bool a_is_soo;
  void **slot_b_local;
  void **slot_a_local;
  ctrl_t *ctrl_b_local;
  ctrl_t *ctrl_a_local;
  
  if ((ctrl_a == (ctrl_t *)0x0) || (ctrl_b == (ctrl_t *)0x0)) {
    ctrl_a_local._7_1_ = true;
  }
  else {
    ppvStack_30 = slot_b;
    slot_b_local = slot_a;
    slot_a_local = (void **)ctrl_b;
    ctrl_b_local = ctrl_a;
    bVar1 = IsSooControl(ctrl_a);
    low_slot._7_1_ = bVar1;
    bVar2 = IsSooControl((ctrl_t *)slot_a_local);
    if (bVar1 == bVar2) {
      if ((low_slot._7_1_ & 1) == 0) {
        hi_slot = *slot_b_local;
        local_48 = *ppvStack_30;
        if (slot_a_local < ctrl_b_local) {
          std::swap<absl::lts_20240722::container_internal::ctrl_t_const*>
                    (&ctrl_b_local,(ctrl_t **)&slot_a_local);
          std::swap<void_const*>(&hi_slot,&local_48);
        }
        local_4d = slot_a_local < hi_slot && hi_slot <= local_48;
        ctrl_a_local._7_1_ = local_4d;
      }
      else {
        ctrl_a_local._7_1_ = *slot_b_local == *ppvStack_30;
      }
    }
    else {
      ctrl_a_local._7_1_ = false;
    }
  }
  return ctrl_a_local._7_1_;
}

Assistant:

inline bool AreItersFromSameContainer(const ctrl_t* ctrl_a,
                                      const ctrl_t* ctrl_b,
                                      const void* const& slot_a,
                                      const void* const& slot_b) {
  // If either control byte is null, then we can't tell.
  if (ctrl_a == nullptr || ctrl_b == nullptr) return true;
  const bool a_is_soo = IsSooControl(ctrl_a);
  if (a_is_soo != IsSooControl(ctrl_b)) return false;
  if (a_is_soo) return slot_a == slot_b;

  const void* low_slot = slot_a;
  const void* hi_slot = slot_b;
  if (ctrl_a > ctrl_b) {
    std::swap(ctrl_a, ctrl_b);
    std::swap(low_slot, hi_slot);
  }
  return ctrl_b < low_slot && low_slot <= hi_slot;
}